

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O3

uint tinf_crc32(void *data,uint length)

{
  ulong uVar1;
  uint uVar2;
  
  if (length != 0) {
    uVar2 = 0xffffffff;
    uVar1 = 0;
    do {
      uVar2 = *(byte *)((long)data + uVar1) ^ uVar2;
      uVar2 = uVar2 >> 4 ^ tinf_crc32tab[uVar2 & 0xf];
      uVar2 = uVar2 >> 4 ^ tinf_crc32tab[uVar2 & 0xf];
      uVar1 = uVar1 + 1;
    } while (length != uVar1);
    return ~uVar2;
  }
  return 0;
}

Assistant:

unsigned int tinf_crc32(const void *data, unsigned int length)
{
	const unsigned char *buf = (const unsigned char *) data;
	unsigned int crc = 0xFFFFFFFF;
	unsigned int i;

	if (length == 0) {
		return 0;
	}

	for (i = 0; i < length; ++i) {
		crc ^= buf[i];
		crc = tinf_crc32tab[crc & 0x0F] ^ (crc >> 4);
		crc = tinf_crc32tab[crc & 0x0F] ^ (crc >> 4);
	}

	return crc ^ 0xFFFFFFFF;
}